

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkIsAcyclic_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  int Fill;
  int Fill_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined8 in_RDX;
  int *piVar8;
  void **ppvVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  char *__format;
  FILE *pFVar11;
  long lVar12;
  Abc_Ntk_t *pAVar13;
  Abc_Obj_t *pAVar14;
  bool bVar15;
  
  uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
  if ((uVar4 != 2) && (uVar4 != 5)) {
    if (uVar4 == 6) {
      __assert_fail("!Abc_ObjIsNet(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x5ff,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
    }
    bVar15 = (*(uint *)&pNode->field_0x14 & 0xe) == 8;
    piVar8 = (int *)CONCAT71((int7)((ulong)in_RDX >> 8),uVar4 == 10 || bVar15);
    if (uVar4 != 10 && !bVar15) {
      pAVar13 = pNode->pNtk;
      if (pAVar13->ntkType == ABC_NTK_STRASH) {
        piVar8 = *(int **)((ulong)pNode & 0xfffffffffffffffe);
        if (*piVar8 != 3) {
          __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
        }
        if ((*(uint *)((long)((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) {
          return 1;
        }
      }
      if (uVar4 != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x602,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
      }
      iVar6 = pNode->Id;
      Vec_IntFillExtra(&pAVar13->vTravIds,iVar6 + 1,(int)piVar8);
      if ((-1 < (long)iVar6) && (iVar6 < (pAVar13->vTravIds).nSize)) {
        pAVar2 = pNode->pNtk;
        if ((pAVar13->vTravIds).pArray[iVar6] == pAVar2->nTravIds + -1) {
          __assert_fail("!Abc_NodeIsTravIdPrevious(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                        ,0x604,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
        }
        iVar6 = pNode->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,Fill);
        if ((-1 < (long)iVar6) && (iVar6 < (pAVar2->vTravIds).nSize)) {
          pAVar3 = pNode->pNtk;
          iVar5 = pAVar3->nTravIds;
          if ((pAVar2->vTravIds).pArray[iVar6] == iVar5) {
            fprintf(_stdout,"Network \"%s\" contains combinational loop!\n",pAVar13->pName);
            pFVar11 = _stdout;
            pcVar7 = Abc_ObjName(pNode);
            __format = "Node \"%s\" is encountered twice on the following path to the COs:\n";
LAB_0085ae39:
            fprintf(pFVar11,__format,pcVar7);
            return 0;
          }
          iVar6 = pNode->Id;
          Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill_00);
          if ((-1 < (long)iVar6) && (iVar6 < (pAVar3->vTravIds).nSize)) {
            (pAVar3->vTravIds).pArray[iVar6] = iVar5;
            iVar6 = extraout_EDX;
            if (0 < (pNode->vFanins).nSize) {
              lVar12 = 0;
              do {
                ppvVar9 = pNode->pNtk->vObjs->pArray;
                pAVar14 = (Abc_Obj_t *)ppvVar9[(pNode->vFanins).pArray[lVar12]];
                pAVar13 = pAVar14->pNtk;
                if (pAVar13->ntkType == ABC_NTK_NETLIST) {
                  ppvVar9 = pAVar13->vObjs->pArray;
                  pAVar14 = (Abc_Obj_t *)ppvVar9[*(pAVar14->vFanins).pArray];
                  pAVar13 = pAVar14->pNtk;
                }
                if (pAVar13 != pNode->pNtk) {
                  __assert_fail("pFanin->pNtk == pNode->pNtk",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                                ,0x613,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
                }
                iVar5 = pAVar14->Id;
                Vec_IntFillExtra(&pAVar13->vTravIds,iVar5 + 1,(int)ppvVar9);
                if (((long)iVar5 < 0) || ((pAVar13->vTravIds).nSize <= iVar5)) goto LAB_0085b059;
                iVar6 = extraout_EDX_00;
                if (((pAVar13->vTravIds).pArray[iVar5] != pAVar14->pNtk->nTravIds + -1) &&
                   (iVar5 = Abc_NtkIsAcyclic_rec(pAVar14), pFVar11 = _stdout,
                   iVar6 = extraout_EDX_01, iVar5 == 0)) {
                  pcVar7 = Abc_ObjName(pAVar14);
                  __format = " %s ->";
                  goto LAB_0085ae39;
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < (pNode->vFanins).nSize);
            }
            if (pNode->pNtk->ntkType == ABC_NTK_STRASH) {
              iVar5 = Abc_AigNodeIsChoice(pNode);
              iVar6 = (int)extraout_RDX;
              if (iVar5 != 0) {
                uVar10 = extraout_RDX;
                for (pAVar14 = (Abc_Obj_t *)(pNode->field_5).pData; iVar6 = (int)uVar10,
                    pAVar14 != (Abc_Obj_t *)0x0; pAVar14 = (Abc_Obj_t *)(pAVar14->field_5).pData) {
                  pAVar13 = pAVar14->pNtk;
                  iVar5 = pAVar14->Id;
                  Vec_IntFillExtra(&pAVar13->vTravIds,iVar5 + 1,iVar6);
                  if (((long)iVar5 < 0) || ((pAVar13->vTravIds).nSize <= iVar5)) goto LAB_0085b059;
                  uVar10 = extraout_RDX_00;
                  if (((pAVar13->vTravIds).pArray[iVar5] != pAVar14->pNtk->nTravIds + -1) &&
                     (iVar6 = Abc_NtkIsAcyclic_rec(pAVar14), pFVar11 = _stdout,
                     uVar10 = extraout_RDX_01, iVar6 == 0)) {
                    pcVar7 = Abc_ObjName(pAVar14);
                    fprintf(pFVar11," %s",pcVar7);
                    pFVar11 = _stdout;
                    pcVar7 = Abc_ObjName(pNode);
                    __format = " (choice of %s) -> ";
                    goto LAB_0085ae39;
                  }
                }
              }
            }
            pAVar13 = pNode->pNtk;
            iVar5 = pNode->Id;
            iVar1 = pAVar13->nTravIds;
            Vec_IntFillExtra(&pAVar13->vTravIds,iVar5 + 1,iVar6);
            if ((-1 < (long)iVar5) && (iVar5 < (pAVar13->vTravIds).nSize)) {
              (pAVar13->vTravIds).pArray[iVar5] = iVar1 + -1;
              return 1;
            }
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
      }
LAB_0085b059:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  return 1;
}

Assistant:

int Abc_NtkIsAcyclic_rec( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    Abc_Obj_t * pFanin;
    int fAcyclic, i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsCi(pNode) || Abc_ObjIsBox(pNode) || (Abc_NtkIsStrash(pNode->pNtk) && Abc_AigNodeIsConst(pNode)) )
        return 1;
    assert( Abc_ObjIsNode(pNode) );
    // make sure the node is not visited
    assert( !Abc_NodeIsTravIdPrevious(pNode) );
    // check if the node is part of the combinational loop
    if ( Abc_NodeIsTravIdCurrent(pNode) )
    {
        fprintf( stdout, "Network \"%s\" contains combinational loop!\n", Abc_NtkName(pNtk) );
        fprintf( stdout, "Node \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(pNode) );
        return 0;
    }
    // mark this node as a node on the current path
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    Abc_ObjForEachFanin( pNode, pFanin, i )
    { 
        pFanin = Abc_ObjFanin0Ntk(pFanin);
        // make sure there is no mixing of networks
        assert( pFanin->pNtk == pNode->pNtk );
        // check if the fanin is visited
        if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
            continue;
        // traverse the fanin's cone searching for the loop
        if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pFanin)) )
            continue;
        // return as soon as the loop is detected
        fprintf( stdout, " %s ->", Abc_ObjName(pFanin) );
        return 0;
    }
    // visit choices
    if ( Abc_NtkIsStrash(pNode->pNtk) && Abc_AigNodeIsChoice(pNode) )
    {
        for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            // check if the fanin is visited
            if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
                continue;
            // traverse the fanin's cone searching for the loop
            if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pFanin)) )
                continue;
            // return as soon as the loop is detected
            fprintf( stdout, " %s", Abc_ObjName(pFanin) );
            fprintf( stdout, " (choice of %s) -> ", Abc_ObjName(pNode) );
            return 0;
        }
    }
    // mark this node as a visited node
    Abc_NodeSetTravIdPrevious( pNode );
    return 1;
}